

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O3

string * __thiscall
flatbuffers::jsons::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BaseType type)

{
  long lVar1;
  undefined8 *puVar2;
  string *extraout_RAX;
  long *plVar3;
  string *extraout_RAX_00;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  char *pcVar7;
  char *pcVar8;
  pointer pcVar9;
  undefined8 uVar10;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  switch((int)this) {
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"boolean\"";
    pcVar7 = "";
    goto LAB_002d05dd;
  case 3:
    NumToString<int>(&local_38,-0x80);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x379591);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar4 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar4) {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._24_8_ = plVar3[3];
      local_98._0_8_ = (string *)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._0_8_ = (string *)*plVar3;
    }
    local_98._8_8_ = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NumToString<int>((string *)&local_78,0x7f);
    pcVar9 = (pointer)0xf;
    if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
      pcVar9 = (pointer)local_98._16_8_;
    }
    if (pcVar9 < (pointer)(local_78._8_8_ + local_98._8_8_)) {
      uVar10 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != &local_68) {
        uVar10 = local_68._M_allocated_capacity;
      }
      if ((pointer)(local_78._8_8_ + local_98._8_8_) <= (ulong)uVar10) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_98._0_8_);
        break;
      }
    }
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_98,local_78._M_allocated_capacity);
    break;
  case 4:
    NumToString<int>((string *)local_98,0xff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3795b2);
    goto LAB_002d06f6;
  case 5:
    NumToString<short>(&local_38,-0x8000);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x379591);
    local_58 = &local_48;
    plVar5 = plVar3 + 2;
    if ((long *)*plVar3 == plVar5) {
      local_48 = *plVar5;
      lStack_40 = plVar3[3];
    }
    else {
      local_48 = *plVar5;
      local_58 = (long *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar4 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar4) {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._24_8_ = plVar3[3];
      local_98._0_8_ = (string *)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._0_8_ = (string *)*plVar3;
    }
    local_98._8_8_ = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NumToString<short>((string *)&local_78,0x7fff);
    pcVar9 = (pointer)0xf;
    if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
      pcVar9 = (pointer)local_98._16_8_;
    }
    if (pcVar9 < (pointer)(local_78._8_8_ + local_98._8_8_)) {
      uVar10 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != &local_68) {
        uVar10 = local_68._M_allocated_capacity;
      }
      if ((pointer)(local_78._8_8_ + local_98._8_8_) <= (ulong)uVar10) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_98._0_8_);
        break;
      }
    }
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_98,local_78._M_allocated_capacity);
    break;
  case 6:
    NumToString<unsigned_short>((string *)local_98,0xffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3795e1);
    goto LAB_002d06f6;
  case 7:
    NumToString<int>(&local_38,-0x80000000);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x379591);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar4 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar4) {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._24_8_ = plVar3[3];
      local_98._0_8_ = (string *)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._0_8_ = (string *)*plVar3;
    }
    local_98._8_8_ = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NumToString<int>((string *)&local_78,0x7fffffff);
    pcVar9 = (pointer)0xf;
    if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
      pcVar9 = (pointer)local_98._16_8_;
    }
    if (pcVar9 < (pointer)(local_78._8_8_ + local_98._8_8_)) {
      uVar10 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != &local_68) {
        uVar10 = local_68._M_allocated_capacity;
      }
      if ((pointer)(local_78._8_8_ + local_98._8_8_) <= (ulong)uVar10) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_98._0_8_);
        break;
      }
    }
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_98,local_78._M_allocated_capacity);
    break;
  case 8:
    NumToString<unsigned_int>((string *)local_98,0xffffffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3795e1);
    goto LAB_002d06f6;
  case 9:
    NumToString<long>(&local_38,-0x8000000000000000);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x379591);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    psVar4 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar4) {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._24_8_ = plVar3[3];
      local_98._0_8_ = (string *)(local_98 + 0x10);
    }
    else {
      local_98._16_8_ = (psVar4->_M_dataplus)._M_p;
      local_98._0_8_ = (string *)*plVar3;
    }
    local_98._8_8_ = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NumToString<long>((string *)&local_78,0x7fffffffffffffff);
    pcVar9 = (pointer)0xf;
    if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
      pcVar9 = (pointer)local_98._16_8_;
    }
    if (pcVar9 < (pointer)(local_78._8_8_ + local_98._8_8_)) {
      uVar10 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_allocated_capacity != &local_68) {
        uVar10 = local_68._M_allocated_capacity;
      }
      if ((pointer)(local_78._8_8_ + local_98._8_8_) <= (ulong)uVar10) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,local_98._0_8_);
        break;
      }
    }
    puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_98,local_78._M_allocated_capacity);
    break;
  case 10:
    NumToString<unsigned_long>((string *)local_98,0xffffffffffffffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x3795e1);
LAB_002d06f6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar6) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_38.field_2._M_allocated_capacity = local_98._16_8_;
    local_38._M_dataplus._M_p = (pointer)local_98._0_8_;
    if ((string *)local_98._0_8_ == (string *)(local_98 + 0x10)) {
      return (string *)(local_98 + 0x10);
    }
    goto LAB_002d0bbe;
  case 0xb:
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"number\"";
    pcVar7 = "";
    goto LAB_002d05dd;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"string\"";
    pcVar7 = "";
    goto LAB_002d05dd;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "";
    pcVar8 = pcVar7;
LAB_002d05dd:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    return extraout_RAX;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar6) {
    uVar10 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar6;
  puVar2[1] = 0;
  *(undefined1 *)psVar6 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,
                    (ulong)(local_68._M_allocated_capacity + 1));
  }
  if ((string *)local_98._0_8_ != (string *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  psVar4 = (string *)&local_38.field_2;
  if ((string *)local_38._M_dataplus._M_p != psVar4) {
LAB_002d0bbe:
    operator_delete(local_38._M_dataplus._M_p,(ulong)(local_38.field_2._M_allocated_capacity + 1));
    psVar4 = extraout_RAX_00;
  }
  return psVar4;
}

Assistant:

static std::string GenType(BaseType type) {
  switch (type) {
    case BASE_TYPE_BOOL: return "\"type\" : \"boolean\"";
    case BASE_TYPE_CHAR:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int8_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int8_t>::max());
    case BASE_TYPE_UCHAR:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :" +
             NumToString(std::numeric_limits<uint8_t>::max());
    case BASE_TYPE_SHORT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int16_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int16_t>::max());
    case BASE_TYPE_USHORT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint16_t>::max());
    case BASE_TYPE_INT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int32_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int32_t>::max());
    case BASE_TYPE_UINT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint32_t>::max());
    case BASE_TYPE_LONG:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int64_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int64_t>::max());
    case BASE_TYPE_ULONG:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint64_t>::max());
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE: return "\"type\" : \"number\"";
    case BASE_TYPE_STRING: return "\"type\" : \"string\"";
    default: return "";
  }
}